

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManSimCollect_rec(Gia_Man_t *pGia,Gia_Obj_t *pObj,Vec_Int_t *vVec)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  
  pGVar3 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar4 = pGia->pObjs;
  if (pGVar4 <= pGVar3) {
    do {
      if (pGVar4 + pGia->nObjs <= pGVar3) break;
      iVar1 = (int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2);
      if (iVar1 * -0x55555555 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(vVec,((uint)pObj & 1) + iVar1 * 0x55555556);
      if ((((ulong)pObj & 1) != 0) ||
         (uVar2 = (uint)*(undefined8 *)pObj, (~uVar2 & 0x9fffffff) == 0)) {
        return;
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                      ,0x3b,"void Gia_ManSimCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      Gia_ManSimCollect_rec
                (pGia,(Gia_Obj_t *)
                      ((ulong)(uVar2 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar2 & 0x1fffffff))),
                 vVec);
      uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      pGVar3 = pObj + -(ulong)(uVar2 & 0x1fffffff);
      pObj = (Gia_Obj_t *)((ulong)(uVar2 >> 0x1d & 1) ^ (ulong)pGVar3);
      pGVar3 = (Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe);
      pGVar4 = pGia->pObjs;
    } while (pGVar4 <= pGVar3);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSimCollect_rec( Gia_Man_t * pGia, Gia_Obj_t * pObj, Vec_Int_t * vVec )
{
    Vec_IntPush( vVec, Gia_ObjToLit(pGia, pObj) );
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild0(pObj), vVec );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild1(pObj), vVec );
}